

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
::pop(UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
      *this)

{
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar1;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
  *this_local;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> ret;
  
  pVar1 = UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::pop
                    (&this->
                      super_UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                    );
  this_local = (UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                *)pVar1.first;
  ret.first._0_4_ = pVar1.second;
  std::
  unordered_set<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>
  ::insert(&this->processed,(value_type *)&this_local);
  pVar1.second = (uint)ret.first;
  pVar1.first = (FlowBlock *)this_local;
  pVar1._12_4_ = 0;
  return pVar1;
}

Assistant:

T pop() {
    T ret = UniqueDeferredQueue<T>::pop();
    processed.insert(ret);
    return ret;
  }